

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.hpp
# Opt level: O3

void __thiscall
foxxll::block_manager::
new_blocks<foxxll::simple_random,__gnu_cxx::__normal_iterator<foxxll::BID<0ul>*,std::vector<foxxll::BID<0ul>,std::allocator<foxxll::BID<0ul>>>>>
          (block_manager *this,simple_random *functor,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_begin,
          __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
          bid_end,size_t alloc_offset)

{
  long *plVar1;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  value_type *ppdVar2;
  value_type pdVar3;
  size_t sVar4;
  ulong uVar5;
  iterator __position;
  size_type new_size;
  external_size_type eVar6;
  undefined1 auVar7 [16];
  void *__s;
  void *__s_00;
  value_type *pvVar8;
  ulong uVar9;
  unsigned_long uVar10;
  long lVar11;
  long lVar12;
  __normal_iterator<foxxll::BID<0UL>_*,_std::vector<foxxll::BID<0UL>,_std::allocator<foxxll::BID<0UL>_>_>_>
  _Var13;
  pointer pvVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  simple_vector<BIDType> bids;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  disk_out;
  unique_lock<std::mutex> lock;
  SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0> local_88;
  ulong local_70;
  simple_random *local_68;
  size_t local_60;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_58;
  unique_lock<std::mutex> local_40;
  
  local_88.array_ = (value_type *)local_88.size_;
  local_40._M_device = &this->mutex_;
  local_40._M_owns = false;
  local_68 = functor;
  local_60 = alloc_offset;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  uVar9 = this->ndisks_;
  if (uVar9 == 0) {
    __s = (void *)0x0;
    __s_00 = (void *)0x0;
  }
  else {
    uVar15 = -(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8;
    __s = operator_new__(uVar15);
    __s_00 = operator_new__(uVar15);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&local_58,uVar9,(allocator_type *)&local_88);
  if (uVar9 != 0) {
    memset(__s,0,uVar9 << 3);
    memset(__s_00,0,uVar9 << 3);
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_88.array_;
  local_88 = (SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>)(auVar7 << 0x40);
  if ((long)bid_end._M_current - (long)bid_begin._M_current != 0) {
    local_70 = ((long)bid_end._M_current - (long)bid_begin._M_current >> 3) * -0x5555555555555555;
    uVar10 = 0;
    _Var13._M_current = bid_begin._M_current;
    do {
      uVar15 = (local_60 + uVar10 + local_68->offset) % (local_68->super_striping).diff_ +
               (local_68->super_striping).begin_;
      ppdVar2 = (this->block_allocators_).array_;
      pdVar3 = ppdVar2[uVar15];
      sVar4 = (_Var13._M_current)->size;
      uVar9 = uVar15;
      if (((pdVar3->autogrow_ == false) &&
          (pdVar3->free_bytes_ < *(long *)((long)__s_00 + uVar15 * 8) + sVar4)) &&
         (uVar5 = this->ndisks_, 1 < uVar5)) {
        lVar11 = uVar5 - 1;
        lVar12 = 1;
        do {
          uVar9 = (lVar12 + uVar15) % uVar5;
          pdVar3 = ppdVar2[uVar9];
          if ((pdVar3->autogrow_ != false) ||
             (*(long *)((long)__s_00 + uVar9 * 8) + sVar4 <= pdVar3->free_bytes_)) break;
          lVar12 = lVar12 + 1;
          lVar11 = lVar11 + -1;
          uVar9 = uVar15;
        } while (lVar11 != 0);
      }
      plVar1 = (long *)((long)__s + uVar9 * 8);
      *plVar1 = *plVar1 + 1;
      plVar1 = (long *)((long)__s_00 + uVar9 * 8);
      *plVar1 = *plVar1 + sVar4;
      this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                (local_58.
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar9);
      __position._M_current = *(unsigned_long **)(this_00 + 8);
      if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>(this_00,__position,&local_88.size_);
      }
      else {
        *__position._M_current = uVar10;
        *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
      }
      uVar10 = local_88.size_ + 1;
      local_88.size_ = uVar10;
      _Var13._M_current = _Var13._M_current + 1;
    } while (uVar10 < local_70);
  }
  local_88.size_ = 0;
  local_88.array_ = (value_type *)0x0;
  if (this->ndisks_ == 0) {
    uVar9 = this->current_allocation_;
    if (this->current_allocation_ < this->maximum_allocation_) {
      uVar9 = this->maximum_allocation_;
    }
    this->maximum_allocation_ = uVar9;
  }
  else {
    uVar9 = 0;
    do {
      new_size = *(size_type *)((long)__s + uVar9 * 8);
      if (new_size != 0) {
        tlx::SimpleVector<foxxll::BID<0UL>,_(tlx::SimpleVectorMode)0>::resize(&local_88,new_size);
        pvVar14 = local_58.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar9;
        if (*(long *)((long)__s + uVar9 * 8) != 0) {
          uVar15 = 0;
          pvVar8 = local_88.array_;
          do {
            uVar10 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[uVar15];
            pvVar8->size = bid_begin._M_current[uVar10].size;
            eVar6 = bid_begin._M_current[uVar10].offset;
            pvVar8->storage = bid_begin._M_current[uVar10].storage;
            pvVar8->offset = eVar6;
            uVar15 = uVar15 + 1;
            pvVar8 = pvVar8 + 1;
          } while (uVar15 < *(ulong *)((long)__s + uVar9 * 8));
        }
        disk_block_allocator::new_blocks<foxxll::BID<0ul>*>
                  ((this->block_allocators_).array_[uVar9],local_88.array_,
                   local_88.array_ + local_88.size_);
        lVar11 = *(long *)((long)__s + uVar9 * 8);
        if (lVar11 != 0) {
          lVar12 = 0;
          pvVar8 = local_88.array_;
          do {
            pvVar8->storage = (this->disk_files_).array_[uVar9].ptr_;
            uVar10 = (pvVar14->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[lVar12];
            bid_begin._M_current[uVar10].size = pvVar8->size;
            eVar6 = pvVar8->offset;
            bid_begin._M_current[uVar10].storage = pvVar8->storage;
            bid_begin._M_current[uVar10].offset = eVar6;
            sVar4 = pvVar8->size;
            auVar16._8_4_ = (int)sVar4;
            auVar16._0_8_ = sVar4;
            auVar16._12_4_ = (int)(sVar4 >> 0x20);
            this->total_allocation_ = sVar4 + this->total_allocation_;
            this->current_allocation_ = auVar16._8_8_ + this->current_allocation_;
            lVar12 = lVar12 + 1;
            pvVar8 = pvVar8 + 1;
          } while (lVar11 != lVar12);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < this->ndisks_);
    uVar9 = this->current_allocation_;
    if (this->current_allocation_ < this->maximum_allocation_) {
      uVar9 = this->maximum_allocation_;
    }
    this->maximum_allocation_ = uVar9;
    if (local_88.array_ != (value_type *)0x0) {
      operator_delete__(local_88.array_);
    }
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_58);
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void block_manager::new_blocks(
    const DiskAssignFunctor& functor,
    BIDIterator bid_begin, BIDIterator bid_end,
    size_t alloc_offset)
{
    std::unique_lock<std::mutex> lock(mutex_);

    using BIDType = typename std::iterator_traits<BIDIterator>::value_type;

    // choose disks for each block, sum up bytes allocated on a disk

    tlx::simple_vector<size_t> disk_blocks(ndisks_);
    tlx::simple_vector<uint64_t> disk_bytes(ndisks_);
    std::vector<std::vector<size_t> > disk_out(ndisks_);

    disk_blocks.fill(0);
    disk_bytes.fill(0);

    size_t bid_size = static_cast<size_t>(bid_end - bid_begin);

    BIDIterator bid = bid_begin;
    for (size_t i = 0; i < bid_size; ++i, ++bid)
    {
        size_t disk_id = functor(alloc_offset + i);

        if (!block_allocators_[disk_id]->has_available_space(
                disk_bytes[disk_id] + bid->size
            ))
        {
            // find disk (cyclically) that has enough free space for block

            for (size_t adv = 1; adv < ndisks_; ++adv)
            {
                size_t try_disk_id = (disk_id + adv) % ndisks_;
                if (block_allocators_[try_disk_id]->has_available_space(
                        disk_bytes[try_disk_id] + bid->size
                    ))
                {
                    disk_id = try_disk_id;
                    break;
                }
            }

            // if no disk has free space, pick first selected by functor
        }

        // assign block to disk
        disk_blocks[disk_id]++;
        disk_bytes[disk_id] += bid->size;
        disk_out[disk_id].push_back(i);
    }

    // allocate blocks on disks in sequence, then scatter blocks into output

    tlx::simple_vector<BIDType> bids;

    for (size_t d = 0; d < ndisks_; ++d)
    {
        if (disk_blocks[d] == 0) continue;
        bids.resize(disk_blocks[d]);

        std::vector<size_t>& bid_perm = disk_out[d];

        // collect bids from output (due to size field for BID<0>)
        for (size_t i = 0; i < disk_blocks[d]; ++i)
            bids[i] = bid_begin[bid_perm[i]];

        // let block_allocator fill in offset fields
        block_allocators_[d]->new_blocks(bids);

        // distributed bids back to output
        for (size_t i = 0; i < disk_blocks[d]; ++i) {
            bids[i].storage = disk_files_[d].get();

            TLX_LOGC(verbose_block_life_cycle) << "BLC:new    " << bids[i];
            bid_begin[bid_perm[i]] = bids[i];

            total_allocation_ += bids[i].size;
            current_allocation_ += bids[i].size;
        }
    }

    maximum_allocation_ = std::max(maximum_allocation_, current_allocation_);
}